

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O1

float vera::distance(vec3 *_point,Line *_line,vec3 *_closes_point)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = (_line->m_direction).field_0.x;
  fVar7 = (_line->m_direction).field_1.y;
  fVar6 = (_line->m_direction).field_2.z;
  fVar1 = _line->m_points[1].field_0.x;
  fVar2 = _line->m_points[1].field_1.y;
  fVar3 = _line->m_points[1].field_2.z;
  fVar7 = ((fVar3 - (_point->field_2).z) * fVar6 +
          (fVar2 - (_point->field_1).y) * fVar7 + (fVar1 - (_point->field_0).x) * fVar5) /
          (fVar6 * fVar6 + fVar7 * fVar7 + fVar5 * fVar5);
  fVar5 = 0.0;
  if ((0.0 <= fVar7) && (fVar5 = fVar7, 1.0 < fVar7)) {
    fVar5 = 1.0;
  }
  fVar7 = _line->m_points[0].field_1.y;
  fVar6 = _line->m_points[0].field_2.z;
  fVar4 = 1.0 - fVar5;
  _closes_point->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (fVar1 * fVar4 + _line->m_points[0].field_0.x * fVar5);
  _closes_point->field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (fVar2 * fVar4 + fVar7 * fVar5);
  (_closes_point->field_2).z = fVar3 * fVar4 + fVar6 * fVar5;
  fVar6 = (_line->m_points[1].field_0.x * fVar4 + _line->m_points[0].field_0.x * fVar5) -
          (_point->field_0).x;
  fVar7 = (_line->m_points[1].field_1.y * fVar4 + _line->m_points[0].field_1.y * fVar5) -
          (_point->field_1).y;
  fVar5 = (fVar4 * _line->m_points[1].field_2.z + fVar5 * _line->m_points[0].field_2.z) -
          (_point->field_2).z;
  fVar5 = fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6;
  if (0.0 <= fVar5) {
    return SQRT(fVar5);
  }
  fVar5 = sqrtf(fVar5);
  return fVar5;
}

Assistant:

float distance(const glm::vec3& _point, const Line& _line, glm::vec3& _closes_point) {
   glm::vec3 dx = _line.getDireciton();
   float m2 = _line.getMagintude2();

   // find parameter value of closest point on segment
   float s12 = glm::dot(_line[1]-_point, dx) / m2;

   if (s12 < 0)
      s12 = 0;
   else if(s12 > 1)
      s12 = 1;
   
   // and find the distance
   _closes_point = s12 * _line[0] + (1.0f - s12) * _line[1];
   return glm::distance(_point, s12 * _line[0] + (1.0f - s12) * _line[1]);
}